

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O1

void __thiscall QHttpNetworkConnectionChannel::_q_connected(QHttpNetworkConnectionChannel *this)

{
  QAbstractSocket *absSocket;
  QLocalSocket *localSocket;
  
  absSocket = (QAbstractSocket *)QMetaObject::cast((QObject *)&QAbstractSocket::staticMetaObject);
  if (absSocket != (QAbstractSocket *)0x0) {
    _q_connected_abstract_socket(this,absSocket);
    return;
  }
  localSocket = (QLocalSocket *)QMetaObject::cast((QObject *)&QLocalSocket::staticMetaObject);
  if (localSocket != (QLocalSocket *)0x0) {
    _q_connected_local_socket(this,localSocket);
    return;
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::_q_connected()
{
    if (auto *s = qobject_cast<QAbstractSocket *>(socket))
        _q_connected_abstract_socket(s);
#if QT_CONFIG(localserver)
    else if (auto *s = qobject_cast<QLocalSocket *>(socket))
        _q_connected_local_socket(s);
#endif
}